

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5ExprPhraseFree(Fts5ExprPhrase *pPhrase)

{
  Fts5IndexIter *pFVar1;
  u8 *puVar2;
  Fts5ExprTerm *pFVar3;
  Fts5ExprTerm *p;
  long lVar4;
  
  if (pPhrase == (Fts5ExprPhrase *)0x0) {
    return;
  }
  if (0 < pPhrase->nTerm) {
    lVar4 = 0;
    do {
      sqlite3_free(pPhrase->aTerm[lVar4].pTerm);
      pFVar1 = pPhrase->aTerm[lVar4].pIter;
      if (pFVar1 != (Fts5IndexIter *)0x0) {
        puVar2 = pFVar1[1].pData;
        fts5IterClose(pFVar1);
        puVar2[0x3c] = '\0';
        puVar2[0x3d] = '\0';
        puVar2[0x3e] = '\0';
        puVar2[0x3f] = '\0';
      }
      p = pPhrase->aTerm[lVar4].pSynonym;
      while (p != (Fts5ExprTerm *)0x0) {
        pFVar1 = p->pIter;
        pFVar3 = p->pSynonym;
        if (pFVar1 != (Fts5IndexIter *)0x0) {
          puVar2 = pFVar1[1].pData;
          fts5IterClose(pFVar1);
          puVar2[0x3c] = '\0';
          puVar2[0x3d] = '\0';
          puVar2[0x3e] = '\0';
          puVar2[0x3f] = '\0';
        }
        sqlite3_free(*(void **)(p + 1));
        p[1].bPrefix = '\0';
        p[1].bFirst = '\0';
        *(undefined6 *)&p[1].field_0x2 = 0;
        p[1].pTerm = (char *)0x0;
        sqlite3_free(p);
        p = pFVar3;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < pPhrase->nTerm);
  }
  if (0 < (pPhrase->poslist).nSpace) {
    sqlite3_free((pPhrase->poslist).p);
    (pPhrase->poslist).p = (u8 *)0x0;
    (pPhrase->poslist).n = 0;
    (pPhrase->poslist).nSpace = 0;
  }
  sqlite3_free(pPhrase);
  return;
}

Assistant:

static void fts5ExprPhraseFree(Fts5ExprPhrase *pPhrase){
  if( pPhrase ){
    int i;
    for(i=0; i<pPhrase->nTerm; i++){
      Fts5ExprTerm *pSyn;
      Fts5ExprTerm *pNext;
      Fts5ExprTerm *pTerm = &pPhrase->aTerm[i];
      sqlite3_free(pTerm->pTerm);
      sqlite3Fts5IterClose(pTerm->pIter);
      for(pSyn=pTerm->pSynonym; pSyn; pSyn=pNext){
        pNext = pSyn->pSynonym;
        sqlite3Fts5IterClose(pSyn->pIter);
        fts5BufferFree((Fts5Buffer*)&pSyn[1]);
        sqlite3_free(pSyn);
      }
    }
    if( pPhrase->poslist.nSpace>0 ) fts5BufferFree(&pPhrase->poslist);
    sqlite3_free(pPhrase);
  }
}